

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O1

void __thiscall temp_box::collect(temp_box *this,cf_face *face,cf_vertex_vec *verts)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  pointer pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  fvector3 edge [2];
  float local_64 [6];
  float local_4c;
  float local_48;
  float local_44;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  if ((face->field_1).dummy >> 0x10 != (uint)this->inner) {
    __assert_fail("inner == face.sector",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sound_envs.cxx"
                  ,0x36,"void temp_box::collect(const cf_face &, const cf_vertex_vec &)");
  }
  if (((face->field_1).dummy & 0x3fff) == (uint)this->outer) {
    if (this->state != 1) {
      puVar9 = (undefined1 *)((long)&face->field_0 + 0x14);
      puVar10 = (undefined1 *)((long)&face->field_0 + 0x10);
      uVar8 = 5;
      uVar7 = 4;
      lVar11 = 2;
      do {
        if (lVar11 == -1) {
          return;
        }
        uVar2 = *(uint *)((long)&face->field_0 + lVar11 * 4);
        puVar9 = puVar9 + -4;
        uVar8 = uVar8 - 1;
        puVar10 = puVar10 + -4;
        uVar7 = uVar7 - 1;
        lVar11 = lVar11 + -1;
      } while (uVar2 != this->base_idx);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar7;
      uVar3 = *(uint *)(puVar10 +
                       (SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU) *
                       -3);
      pcVar4 = (verts->super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>).
               _M_impl.super__Vector_impl_data._M_start;
      fVar15 = pcVar4[uVar2].p.field_0.field_0.x;
      local_64[3] = pcVar4[uVar3].p.field_0.field_0.x - fVar15;
      fVar16 = pcVar4[uVar2].p.field_0.field_0.y;
      local_64[4] = pcVar4[uVar3].p.field_0.field_0.y - fVar16;
      fVar13 = pcVar4[uVar2].p.field_0.field_0.z;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar8;
      local_64[5] = pcVar4[uVar3].p.field_0.field_0.z - fVar13;
      uVar2 = *(uint *)(puVar9 + (SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                                 0xfffffffffffffffcU) * -3);
      local_4c = pcVar4[uVar2].p.field_0.field_0.x - fVar15;
      local_48 = pcVar4[uVar2].p.field_0.field_0.y - fVar16;
      local_44 = pcVar4[uVar2].p.field_0.field_0.z - fVar13;
      lVar11 = 0x18;
      do {
        local_64[0] = *(float *)((long)local_64 + lVar11);
        local_64[1] = *(float *)((long)local_64 + lVar11 + 4);
        fVar15 = (this->xform).field_0.field_0._11;
        fVar16 = (this->xform).field_0.field_0._12;
        fVar13 = (this->xform).field_0.field_0._13;
        fVar1 = *(float *)((long)local_64 + lVar11 + 8);
        fVar14 = fVar1 * fVar1 + local_64[0] * local_64[0] + local_64[1] * local_64[1];
        fVar12 = (fVar13 * fVar13 + fVar15 * fVar15 + fVar16 * fVar16) * fVar14;
        if (fVar12 < 0.0) {
          local_28._0_4_ = fVar14;
          local_38 = ZEXT416((uint)fVar13);
          local_64[2] = fVar16;
          fVar12 = sqrtf(fVar12);
          fVar14 = (float)local_28._0_4_;
          fVar13 = (float)local_38._0_4_;
          fVar16 = local_64[2];
        }
        else {
          fVar12 = SQRT(fVar12);
        }
        fVar12 = (fVar13 * fVar1 + fVar15 * local_64[0] + fVar16 * local_64[1]) / fVar12;
        if ((float)(~-(uint)(fVar12 < 0.0) & (uint)fVar12 |
                   (uint)(0.0 - fVar12) & -(uint)(fVar12 < 0.0)) < 0.001) {
          fVar15 = (this->xform).field_0.field_0._21;
          fVar16 = (this->xform).field_0.field_0._22;
          fVar13 = (this->xform).field_0.field_0._23;
          fVar14 = fVar14 * (fVar13 * fVar13 + fVar15 * fVar15 + fVar16 * fVar16);
          if (fVar14 < 0.0) {
            local_28 = ZEXT416((uint)fVar13);
            local_38._0_4_ = fVar15;
            fVar14 = sqrtf(fVar14);
            fVar13 = (float)local_28._0_4_;
            fVar15 = (float)local_38._0_4_;
          }
          else {
            fVar14 = SQRT(fVar14);
          }
          fVar14 = (fVar13 * fVar1 + fVar15 * local_64[0] + fVar16 * local_64[1]) / fVar14;
          if ((float)(~-(uint)(fVar14 < 0.0) & (uint)fVar14 |
                     (uint)(0.0 - fVar14) & -(uint)(fVar14 < 0.0)) < 0.001) {
            (this->xform).field_0.field_0._31 = local_64[0];
            (this->xform).field_0.field_0._32 = local_64[1];
            (this->xform).field_0.field_0._33 = fVar1;
            this->state = 1;
            fVar15 = (this->xform).field_0.field_0._12;
            fVar16 = (this->xform).field_0.field_0._22;
            fVar13 = (this->xform).field_0.field_0._13;
            fVar14 = (this->xform).field_0.field_0._23;
            (this->xform).field_0.field_0._41 =
                 ((this->xform).field_0.field_0._11 + (this->xform).field_0.field_0._21 +
                 local_64[0]) * 0.5 + (this->xform).field_0.field_0._41;
            (this->xform).field_0.field_0._42 =
                 (fVar15 + fVar16 + local_64[1]) * 0.5 + (this->xform).field_0.field_0._42;
            (this->xform).field_0.field_0._43 =
                 (fVar13 + fVar14 + fVar1) * 0.5 + (this->xform).field_0.field_0._43;
            return;
          }
        }
        lVar11 = lVar11 + -0xc;
      } while (lVar11 != 0);
    }
    return;
  }
  __assert_fail("outer == face.material",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sound_envs.cxx"
                ,0x37,"void temp_box::collect(const cf_face &, const cf_vertex_vec &)");
}

Assistant:

void temp_box::collect(const cf_face& face, const cf_vertex_vec& verts)
{
	// FIXME: this code will not work in a (legal) situation with intersecting
	// sound volumes. So far I am not aware of any real examples, though.
	xr_assert(inner == face.sector);
	xr_assert(outer == face.material);
	if (state == STATE_DONE)
		return;
	for (uint_fast32_t k = 3; k != 0;) {
		if (face.v[--k] != base_idx)
			continue;
		fvector3 edge[2];
		edge[0].sub(verts[face.v[(k+1)%3]].p, verts[face.v[k]].p);
		edge[1].sub(verts[face.v[(k+2)%3]].p, verts[face.v[k]].p);
		for (uint_fast32_t i = 2; i != 0;) {
			--i;
			if (equivalent(xform.i.cosine(edge[i]), 0.f, k_zero_tolerance) &&
					equivalent(xform.j.cosine(edge[i]), 0.f, k_zero_tolerance)) {
				xform.k.set(edge[i]);
				state = STATE_DONE;
				xform.c.add(fvector3().add(xform.i, xform.j).add(xform.k).mul(0.5f));
				return;
			}
		}
		break;
	}
}